

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 jx9HashmapDup(jx9_hashmap *pSrc,jx9_hashmap *pDest)

{
  jx9_hashmap_node *pNode;
  sxi32 in_EAX;
  sxi32 sVar1;
  jx9_value *pValue;
  uint uVar2;
  jx9_hashmap_node **ppjVar3;
  jx9_value sKey;
  jx9_value local_70;
  
  if (pSrc != pDest) {
    ppjVar3 = &pSrc->pFirst;
    for (uVar2 = 0; uVar2 < pSrc->nEntry; uVar2 = uVar2 + 1) {
      pNode = *ppjVar3;
      pValue = HashmapExtractNodeValue(pNode);
      if (pNode->iType == 2) {
        jx9MemObjInitFromString(pDest->pVm,&local_70,(SyString *)0x0);
        jx9MemObjStringAppend(&local_70,(char *)(pNode->xKey).sKey.pBlob,(pNode->xKey).sKey.nByte);
        sVar1 = HashmapInsert(pDest,&local_70,pValue);
        in_EAX = jx9MemObjRelease(&local_70);
      }
      else {
        sVar1 = HashmapInsertIntKey(pDest,(pNode->xKey).iKey,pValue);
        in_EAX = sVar1;
      }
      if (sVar1 != 0) {
        return in_EAX;
      }
      ppjVar3 = &pNode->pPrev;
    }
  }
  return in_EAX;
}

Assistant:

JX9_PRIVATE sxi32 jx9HashmapDup(jx9_hashmap *pSrc, jx9_hashmap *pDest)
{
	jx9_hashmap_node *pEntry;
	jx9_value sKey, *pVal;
	sxi32 rc;
	sxu32 n;
	if( pSrc == pDest ){
		/* Same map. This can easily happen since hashmaps are passed by reference.
		 * Unlike the  engine.
		 */
		return SXRET_OK;
	}
	/* Point to the first inserted entry in the source */
	pEntry = pSrc->pFirst;
	/* Perform the duplication */
	for( n = 0 ; n < pSrc->nEntry ; ++n ){
		/* Extract the node value */
		pVal = HashmapExtractNodeValue(pEntry);
		if( pEntry->iType == HASHMAP_BLOB_NODE ){
			/* Blob key insertion */
			jx9MemObjInitFromString(pDest->pVm, &sKey, 0);
			jx9MemObjStringAppend(&sKey, (const char *)SyBlobData(&pEntry->xKey.sKey), SyBlobLength(&pEntry->xKey.sKey));
			rc = jx9HashmapInsert(&(*pDest), &sKey, pVal);
			jx9MemObjRelease(&sKey);
		}else{
			/* Int key insertion */
			rc = HashmapInsertIntKey(&(*pDest), pEntry->xKey.iKey, pVal);
		}
		if( rc != SXRET_OK ){
			return rc;
		}
		/* Point to the next entry */
		pEntry = pEntry->pPrev; /* Reverse link */
	}
	return SXRET_OK;
}